

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int fits_copy_image_section(fitsfile *fptr,fitsfile *newptr,char *expr,int *status)

{
  int *status_00;
  fitsfile *pfVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  double *array;
  long lVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  char cVar12;
  char *pcVar13;
  long *plVar14;
  uint uVar15;
  long *plVar16;
  char *pcVar17;
  int naxis;
  int *local_318;
  int anynull;
  int tstatus;
  fitsfile *local_308;
  fitsfile *local_300;
  long local_2f8;
  int bitpix;
  char *local_2e8;
  char *local_2e0;
  long local_2d8;
  double local_2d0;
  char *local_2c8;
  double local_2c0;
  char *local_2b8;
  long smin;
  int numkeys;
  double local_2a0;
  long smax;
  long local_290;
  long local_288;
  char *local_280;
  char *cptr;
  long sinc;
  long incs [9];
  long lpixels [9];
  long fpixels [9];
  long naxes [9];
  char keyname [75];
  long outnaxes [9];
  char card [81];
  
  lVar10 = 9;
  plVar14 = &DAT_001be2c0;
  plVar16 = naxes;
  for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
    *plVar16 = *plVar14;
    plVar14 = plVar14 + 1;
    plVar16 = plVar16 + 1;
  }
  plVar14 = &DAT_001be2c0;
  plVar16 = fpixels;
  for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
    *plVar16 = *plVar14;
    plVar14 = plVar14 + 1;
    plVar16 = plVar16 + 1;
  }
  plVar14 = &DAT_001be2c0;
  plVar16 = lpixels;
  for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
    *plVar16 = *plVar14;
    plVar14 = plVar14 + 1;
    plVar16 = plVar16 + 1;
  }
  plVar14 = &DAT_001be2c0;
  plVar16 = incs;
  for (; lVar10 != 0; lVar10 = lVar10 + -1) {
    *plVar16 = *plVar14;
    plVar14 = plVar14 + 1;
    plVar16 = plVar16 + 1;
  }
  if (0 < *status) {
    return *status;
  }
  ffgidt(fptr,&bitpix,status);
  ffgidm(fptr,&naxis,status);
  iVar3 = ffgisz(fptr,naxis,naxes,status);
  if (iVar3 < 1) {
    if (naxis - 5U < 0xfffffffc) {
      pcVar13 = "Input image either had NAXIS = 0 (NULL image) or has > 4 dimensions";
LAB_00112f24:
      ffpmsg(pcVar13);
      *status = 0xd4;
      return 0xd4;
    }
    ffcrim(newptr,bitpix,naxis,naxes,status);
    ffghsp(fptr,&numkeys,(int *)0x0,status);
    for (iVar3 = 4; iVar3 <= numkeys; iVar3 = iVar3 + 1) {
      ffgrec(fptr,iVar3,card,status);
      iVar4 = ffgkcl(card);
      if (0x14 < iVar4) {
        ffprec(newptr,card,status);
      }
    }
    if (*status < 1) {
      lVar10 = 0;
      local_318 = status;
      local_308 = fptr;
      local_300 = newptr;
      local_2c8 = expr;
      cptr = expr;
LAB_00112ff5:
      pfVar1 = local_300;
      if (lVar10 < naxis) {
        iVar3 = fits_get_section_range(&cptr,&smin,&smax,&sinc,status);
        lVar9 = sinc;
        if (0 < iVar3) {
          ffpmsg("error parsing the following image section specifier:");
          pcVar13 = local_2c8;
          goto LAB_00112fc1;
        }
        if (smax == 0) {
          lVar6 = naxes[lVar10];
          smax = lVar6;
        }
        else {
          lVar6 = naxes[lVar10];
          if (smin == 0) {
            smin = lVar6;
          }
        }
        lVar2 = smax;
        lVar8 = smin;
        local_2e8 = (char *)smax;
        local_2d8 = smin;
        if ((lVar6 < smin) || (lVar6 < smax)) {
          ffpmsg("image section exceeds dimensions of input image:");
          pcVar13 = local_2c8;
          goto LAB_00112f24;
        }
        fpixels[lVar10] = smin;
        lpixels[lVar10] = smax;
        lVar6 = smin - smax;
        if (smin - smax == 0 || smin < smax) {
          lVar6 = -(smin - smax);
        }
        incs[lVar10] = sinc;
        lVar6 = (lVar6 + sinc) / sinc;
        outnaxes[lVar10] = lVar6;
        local_2f8 = lVar10 + 1;
        ffkeyn("NAXIS",(int)local_2f8,keyname,status);
        lVar10 = local_2f8;
        ffmkyj(local_300,keyname,lVar6,(char *)0x0,status);
        pfVar1 = local_300;
        if (lVar9 != 1 || lVar8 != 1) {
          local_2c0 = (double)lVar8;
          lVar6 = -lVar9;
          if (lVar8 <= lVar2) {
            lVar6 = lVar9;
          }
          local_2b8 = (char *)(double)lVar6;
          local_2e0 = (char *)lVar9;
          pcVar13 = (char *)lVar9;
          pcVar11 = local_2e0;
          iVar3 = -1;
LAB_0011316d:
          do {
            iVar4 = iVar3;
            local_2e0 = pcVar11;
            pcVar17 = pcVar13;
            status = local_318;
            if (iVar4 == 0x1a) break;
            ffkeyn("CRPIX",(int)lVar10,keyname,local_318);
            iVar3 = iVar4 + 1;
            cVar12 = (char)iVar4;
            if (iVar3 != 0) {
              sVar7 = strlen(keyname);
              keyname[(int)sVar7] = cVar12 + 'A';
              keyname[(long)((sVar7 << 0x20) + 0x100000000) >> 0x20] = '\0';
            }
            tstatus = 0;
            iVar5 = ffgky(local_308,0x52,keyname,&local_2a0,(char *)0x0,&tstatus);
            pcVar13 = pcVar17;
            lVar10 = local_2f8;
            pcVar11 = local_2e0;
            if (iVar5 == 0) {
              if ((long)local_2e8 < local_2d8) {
                local_2a0 = local_2c0 - local_2a0;
              }
              else {
                local_2a0 = local_2a0 - local_2c0;
              }
              local_2a0 = local_2a0 / (double)(long)local_2e0 + 1.0;
              ffmkyd(pfVar1,keyname,local_2a0,0xf,(char *)0x0,local_318);
              if (pcVar17 == (char *)0x1) {
                local_2e0 = (char *)0x1;
                pcVar13 = (char *)0x1;
                lVar10 = local_2f8;
                pcVar11 = local_2e0;
                if (local_2d8 <= (long)local_2e8) goto LAB_0011316d;
              }
              ffkeyn("CDELT",(int)local_2f8,keyname,local_318);
              if (iVar4 != -1) {
                sVar7 = strlen(keyname);
                keyname[(int)sVar7] = cVar12 + 'A';
                keyname[(long)((sVar7 << 0x20) + 0x100000000) >> 0x20] = '\0';
              }
              tstatus = 0;
              iVar5 = ffgky(local_308,0x52,keyname,&local_2d0,(char *)0x0,&tstatus);
              if (iVar5 == 0) {
                local_2d0 = local_2d0 * (double)local_2b8;
                ffmkyd(pfVar1,keyname,local_2d0,0xf,(char *)0x0,local_318);
                pcVar17 = (char *)lVar9;
              }
              ffkeyn("CD1_",(int)local_2f8,keyname,local_318);
              if (iVar4 != -1) {
                sVar7 = strlen(keyname);
                keyname[(int)sVar7] = cVar12 + 'A';
                keyname[(long)((sVar7 << 0x20) + 0x100000000) >> 0x20] = '\0';
              }
              for (iVar4 = -9; pcVar13 = pcVar17, lVar10 = local_2f8, pcVar11 = pcVar17, iVar4 != 0;
                  iVar4 = iVar4 + 1) {
                keyname[2] = (char)iVar4 + ':';
                tstatus = 0;
                iVar5 = ffgky(local_308,0x52,keyname,&local_2d0,(char *)0x0,&tstatus);
                if (iVar5 == 0) {
                  local_2d0 = local_2d0 * (double)local_2b8;
                  ffmkyd(pfVar1,keyname,local_2d0,0xf,(char *)0x0,local_318);
                  pcVar17 = (char *)lVar9;
                }
              }
            }
          } while( true );
        }
        goto LAB_00112ff5;
      }
      iVar3 = ffrdef(local_300,status);
      if (0 < iVar3) goto LAB_00112f0d;
      ffpscl(local_308,1.0,0.0,status);
      ffpscl(pfVar1,1.0,0.0,status);
      uVar15 = -bitpix;
      if (0 < bitpix) {
        uVar15 = bitpix;
      }
      array = (double *)malloc((ulong)(uVar15 >> 3) * outnaxes[0]);
      lVar10 = fpixels[1];
      if (array == (double *)0x0) {
        ffpmsg("fits_copy_image_section: no memory for image section");
        *status = 0x71;
        return 0x71;
      }
      local_288 = fpixels[3];
      local_290 = lpixels[3];
      lVar9 = fpixels[3] - lpixels[3];
      if (fpixels[3] - lpixels[3] == 0 || fpixels[3] < lpixels[3]) {
        lVar9 = -(fpixels[3] - lpixels[3]);
      }
      local_2d8 = fpixels[2];
      local_2c0 = (double)lpixels[2];
      lVar6 = fpixels[2] - lpixels[2];
      if (fpixels[2] - lpixels[2] == 0 || fpixels[2] < lpixels[2]) {
        lVar6 = -(fpixels[2] - lpixels[2]);
      }
      local_2f8 = lpixels[1];
      lVar8 = fpixels[1] - lpixels[1];
      if (fpixels[1] - lpixels[1] == 0 || fpixels[1] < lpixels[1]) {
        lVar8 = -(fpixels[1] - lpixels[1]);
      }
      local_2b8 = (char *)((lVar8 + incs[1]) / incs[1]);
      local_2e8 = (char *)((lVar6 + incs[2]) / incs[2]);
      local_280 = (char *)((lVar9 + incs[3]) / incs[3]);
      pcVar13 = (char *)0x0;
      if ((long)local_2b8 < 1) {
        local_2b8 = pcVar13;
      }
      if ((long)local_2e8 < 1) {
        local_2e8 = pcVar13;
      }
      if ((long)local_280 < 1) {
        local_280 = pcVar13;
      }
      lVar9 = 1;
      while (pcVar13 != local_280) {
        lVar6 = -(incs[3] * (long)pcVar13);
        if (local_288 <= local_290) {
          lVar6 = incs[3] * (long)pcVar13;
        }
        lpixels[3] = lVar6 + local_288;
        pcVar11 = (char *)0x0;
        local_2c8 = pcVar13;
        fpixels[3] = lpixels[3];
        while (pcVar11 != local_2e8) {
          lVar6 = -(incs[2] * (long)pcVar11);
          if (local_2d8 <= (long)local_2c0) {
            lVar6 = incs[2] * (long)pcVar11;
          }
          lpixels[2] = lVar6 + local_2d8;
          local_2e0 = pcVar11;
          fpixels[2] = lpixels[2];
          for (pcVar13 = (char *)0x0; status_00 = local_318, local_2b8 != pcVar13;
              pcVar13 = pcVar13 + 1) {
            lVar6 = -(incs[1] * (long)pcVar13);
            if (lVar10 <= local_2f8) {
              lVar6 = incs[1] * (long)pcVar13;
            }
            lpixels[1] = lVar6 + lVar10;
            fpixels[1] = lpixels[1];
            if (bitpix == -0x40) {
              ffgsvd(local_308,1,naxis,naxes,fpixels,lpixels,incs,-9.1191291391491e-36,array,
                     &anynull,local_318);
              ffppnd(local_300,1,lVar9,outnaxes[0],array,-9.1191291391491e-36,status_00);
            }
            else if (bitpix == -0x20) {
              ffgsve(local_308,1,naxis,naxes,fpixels,lpixels,incs,-9.11912e-36,(float *)array,
                     &anynull,local_318);
              ffppne(local_300,1,lVar9,outnaxes[0],(float *)array,-9.11912e-36,status_00);
            }
            else if (bitpix == 0x40) {
              ffgsvjj(local_308,1,naxis,naxes,fpixels,lpixels,incs,0,(LONGLONG *)array,&anynull,
                      local_318);
              ffpprjj(local_300,1,lVar9,outnaxes[0],(LONGLONG *)array,status_00);
            }
            else if (bitpix == 0x10) {
              ffgsvi(local_308,1,naxis,naxes,fpixels,lpixels,incs,0,(short *)array,&anynull,
                     local_318);
              ffppri(local_300,1,lVar9,outnaxes[0],(short *)array,status_00);
            }
            else if (bitpix == 0x20) {
              ffgsvk(local_308,1,naxis,naxes,fpixels,lpixels,incs,0,(int *)array,&anynull,local_318)
              ;
              ffpprk(local_300,1,lVar9,outnaxes[0],(int *)array,status_00);
            }
            else if (bitpix == 8) {
              ffgsvb(local_308,1,naxis,naxes,fpixels,lpixels,incs,'\0',(uchar *)array,&anynull,
                     local_318);
              ffpprb(local_300,1,lVar9,outnaxes[0],(uchar *)array,status_00);
            }
            lVar9 = lVar9 + outnaxes[0];
          }
          pcVar11 = local_2e0 + 1;
        }
        pcVar13 = local_2c8 + 1;
      }
      free(array);
      if (*local_318 < 1) {
        return *local_318;
      }
      pcVar13 = "fits_copy_image_section: error copying image section";
      status = local_318;
    }
    else {
      pcVar13 = "error copying header from input image to output image";
    }
LAB_00112fc1:
    ffpmsg(pcVar13);
  }
LAB_00112f0d:
  return *status;
}

Assistant:

int fits_copy_image_section(
           fitsfile *fptr,  /* I - pointer to input image */
           fitsfile *newptr,  /* I - pointer to output image */
           char *expr,       /* I - Image section expression    */
           int *status)
{
  /*
     copies an image section from the input file to a new output HDU
  */

    int bitpix, naxis, numkeys, nkey;
    long naxes[] = {1,1,1,1,1,1,1,1,1}, smin, smax, sinc;
    long fpixels[] = {1,1,1,1,1,1,1,1,1};
    long lpixels[] = {1,1,1,1,1,1,1,1,1};
    long incs[] = {1,1,1,1,1,1,1,1,1};
    char *cptr, keyname[FLEN_KEYWORD], card[FLEN_CARD];
    int ii, tstatus, anynull;
    long minrow, maxrow, minslice, maxslice, mincube, maxcube;
    long firstpix;
    long ncubeiter, nsliceiter, nrowiter, kiter, jiter, iiter;
    int klen, kk, jj;
    long outnaxes[9], outsize, buffsize;
    double *buffer, crpix, cdelt;

    if (*status > 0)
        return(*status);

    /* get the size of the input image */
    fits_get_img_type(fptr, &bitpix, status);
    fits_get_img_dim(fptr, &naxis, status);
    if (fits_get_img_size(fptr, naxis, naxes, status) > 0)
        return(*status);

    if (naxis < 1 || naxis > 4)
    {
        ffpmsg(
        "Input image either had NAXIS = 0 (NULL image) or has > 4 dimensions");
        return(*status = BAD_NAXIS);
    }

    /* create output image with same size and type as the input image */
    /*  Will update the size later */
    fits_create_img(newptr, bitpix, naxis, naxes, status);

    /* copy all other non-structural keywords from the input to output file */
    fits_get_hdrspace(fptr, &numkeys, NULL, status);

    for (nkey = 4; nkey <= numkeys; nkey++) /* skip the first few keywords */
    {
        fits_read_record(fptr, nkey, card, status);

        if (fits_get_keyclass(card) > TYP_CMPRS_KEY)
        {
            /* write the record to the output file */
            fits_write_record(newptr, card, status);
        }
    }

    if (*status > 0)
    {
         ffpmsg("error copying header from input image to output image");
         return(*status);
    }

    /* parse the section specifier to get min, max, and inc for each axis */
    /* and the size of each output image axis */

    cptr = expr;
    for (ii=0; ii < naxis; ii++)
    {
       if (fits_get_section_range(&cptr, &smin, &smax, &sinc, status) > 0)
       {
          ffpmsg("error parsing the following image section specifier:");
          ffpmsg(expr);
          return(*status);
       }

       if (smax == 0)
          smax = naxes[ii];   /* use whole axis  by default */
       else if (smin == 0)
          smin = naxes[ii];   /* use inverted whole axis */

       if (smin > naxes[ii] || smax > naxes[ii])
       {
          ffpmsg("image section exceeds dimensions of input image:");
          ffpmsg(expr);
          return(*status = BAD_NAXIS);
       }

       fpixels[ii] = smin;
       lpixels[ii] = smax;
       incs[ii] = sinc;

       if (smin <= smax)
           outnaxes[ii] = (smax - smin + sinc) / sinc;
       else
           outnaxes[ii] = (smin - smax + sinc) / sinc;

       /* modify the NAXISn keyword */
       fits_make_keyn("NAXIS", ii + 1, keyname, status);
       fits_modify_key_lng(newptr, keyname, outnaxes[ii], NULL, status);

       /* modify the WCS keywords if necessary */

       if (fpixels[ii] != 1 || incs[ii] != 1)
       {
            for (kk=-1;kk<26; kk++)  /* modify any alternate WCS keywords */
	{
         /* read the CRPIXn keyword if it exists in the input file */
         fits_make_keyn("CRPIX", ii + 1, keyname, status);
	 
         if (kk != -1) {
	   klen = strlen(keyname);
	   keyname[klen]='A' + kk;
	   keyname[klen + 1] = '\0';
	 }

         tstatus = 0;
         if (fits_read_key(fptr, TDOUBLE, keyname, 
             &crpix, NULL, &tstatus) == 0)
         {
           /* calculate the new CRPIXn value */
           if (fpixels[ii] <= lpixels[ii]) {
             crpix = (crpix - (fpixels[ii])) / incs[ii] + 1.0;
              /*  crpix = (crpix - (fpixels[ii] - 1.0) - .5) / incs[ii] + 0.5; */
           } else {
             crpix = (fpixels[ii] - crpix)  / incs[ii] + 1.0;
             /* crpix = (fpixels[ii] - (crpix - 1.0) - .5) / incs[ii] + 0.5; */
           }

           /* modify the value in the output file */
           fits_modify_key_dbl(newptr, keyname, crpix, 15, NULL, status);

           if (incs[ii] != 1 || fpixels[ii] > lpixels[ii])
           {
             /* read the CDELTn keyword if it exists in the input file */
             fits_make_keyn("CDELT", ii + 1, keyname, status);

             if (kk != -1) {
	       klen = strlen(keyname);
	       keyname[klen]='A' + kk;
	       keyname[klen + 1] = '\0';
	     }

             tstatus = 0;
             if (fits_read_key(fptr, TDOUBLE, keyname, 
                 &cdelt, NULL, &tstatus) == 0)
             {
               /* calculate the new CDELTn value */
               if (fpixels[ii] <= lpixels[ii])
                 cdelt = cdelt * incs[ii];
               else
                 cdelt = cdelt * (-incs[ii]);
              
               /* modify the value in the output file */
               fits_modify_key_dbl(newptr, keyname, cdelt, 15, NULL, status);
             }

             /* modify the CDi_j keywords if they exist in the input file */

             fits_make_keyn("CD1_", ii + 1, keyname, status);

             if (kk != -1) {
	       klen = strlen(keyname);
	       keyname[klen]='A' + kk;
	       keyname[klen + 1] = '\0';
	     }

             for (jj=0; jj < 9; jj++)   /* look for up to 9 dimensions */
	     {
	       keyname[2] = '1' + jj;
	       
               tstatus = 0;
               if (fits_read_key(fptr, TDOUBLE, keyname, 
                 &cdelt, NULL, &tstatus) == 0)
               {
                 /* calculate the new CDi_j value */
                 if (fpixels[ii] <= lpixels[ii])
                   cdelt = cdelt * incs[ii];
                 else
                   cdelt = cdelt * (-incs[ii]);
              
                 /* modify the value in the output file */
                 fits_modify_key_dbl(newptr, keyname, cdelt, 15, NULL, status);
               }
	     }
	     
           } /* end of if (incs[ii]... loop */
         }   /* end of fits_read_key loop */
	}    /* end of for (kk  loop */
       }
    }  /* end of main NAXIS loop */

    if (ffrdef(newptr, status) > 0)  /* force the header to be scanned */
    {
        return(*status);
    }

    /* turn off any scaling of the pixel values */
    fits_set_bscale(fptr,  1.0, 0.0, status);
    fits_set_bscale(newptr, 1.0, 0.0, status);

    /* to reduce memory foot print, just read/write image 1 row at a time */

    outsize = outnaxes[0];
    buffsize = (abs(bitpix) / 8) * outsize;

    buffer = (double *) malloc(buffsize); /* allocate memory for the image row */
    if (!buffer)
    {
        ffpmsg("fits_copy_image_section: no memory for image section");
        return(*status = MEMORY_ALLOCATION);
    }

    /* read the image section then write it to the output file */

    minrow = fpixels[1];
    maxrow = lpixels[1];
    if (minrow > maxrow) {
        nrowiter = (minrow - maxrow + incs[1]) / incs[1];
    } else {
        nrowiter = (maxrow - minrow + incs[1]) / incs[1];
    }

    minslice = fpixels[2];
    maxslice = lpixels[2];
    if (minslice > maxslice) {
        nsliceiter = (minslice - maxslice + incs[2]) / incs[2];
    } else {
        nsliceiter = (maxslice - minslice + incs[2]) / incs[2];
    }

    mincube = fpixels[3];
    maxcube = lpixels[3];
    if (mincube > maxcube) {
        ncubeiter = (mincube - maxcube + incs[3]) / incs[3];
    } else {
        ncubeiter = (maxcube - mincube + incs[3]) / incs[3];
    }

    firstpix = 1;
    for (kiter = 0; kiter < ncubeiter; kiter++)
    {
      if (mincube > maxcube) {
	 fpixels[3] = mincube - (kiter * incs[3]);
      } else {
	 fpixels[3] = mincube + (kiter * incs[3]);
      }
      
      lpixels[3] = fpixels[3];

      for (jiter = 0; jiter < nsliceiter; jiter++)
      {
        if (minslice > maxslice) {
	    fpixels[2] = minslice - (jiter * incs[2]);
        } else {
	    fpixels[2] = minslice + (jiter * incs[2]);
        }

	lpixels[2] = fpixels[2];

        for (iiter = 0; iiter < nrowiter; iiter++)
        {
            if (minrow > maxrow) {
	       fpixels[1] = minrow - (iiter * incs[1]);
	    } else {
	       fpixels[1] = minrow + (iiter * incs[1]);
            }

	    lpixels[1] = fpixels[1];

	    if (bitpix == 8)
	    {
	        ffgsvb(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (unsigned char *) buffer, &anynull, status);

	        ffpprb(newptr, 1, firstpix, outsize, (unsigned char *) buffer, status);
	    }
	    else if (bitpix == 16)
	    {
	        ffgsvi(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (short *) buffer, &anynull, status);

	        ffppri(newptr, 1, firstpix, outsize, (short *) buffer, status);
	    }
	    else if (bitpix == 32)
	    {
	        ffgsvk(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (int *) buffer, &anynull, status);

	        ffpprk(newptr, 1, firstpix, outsize, (int *) buffer, status);
	    }
	    else if (bitpix == -32)
	    {
	        ffgsve(fptr, 1, naxis, naxes, fpixels, lpixels, incs, FLOATNULLVALUE,
	            (float *) buffer, &anynull, status);

	        ffppne(newptr, 1, firstpix, outsize, (float *) buffer, FLOATNULLVALUE, status);
	    }
	    else if (bitpix == -64)
	    {
	        ffgsvd(fptr, 1, naxis, naxes, fpixels, lpixels, incs, DOUBLENULLVALUE,
	             buffer, &anynull, status);

	        ffppnd(newptr, 1, firstpix, outsize, buffer, DOUBLENULLVALUE,
	               status);
	    }
	    else if (bitpix == 64)
	    {
	        ffgsvjj(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (LONGLONG *) buffer, &anynull, status);

	        ffpprjj(newptr, 1, firstpix, outsize, (LONGLONG *) buffer, status);
	    }

            firstpix += outsize;
        }
      }
    }

    free(buffer);  /* finished with the memory */

    if (*status > 0)
    {
        ffpmsg("fits_copy_image_section: error copying image section");
        return(*status);
    }

    return(*status);
}